

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_ienv.c
# Opt level: O0

int sp_ienv(int ispec)

{
  int local_14;
  int local_10;
  int i;
  int ispec_local;
  
  switch(ispec) {
  case 1:
    i = 0x14;
    break;
  case 2:
    i = 10;
    break;
  case 3:
    i = 200;
    break;
  case 4:
    i = 200;
    break;
  case 5:
    i = 100;
    break;
  case 6:
    i = 0x1e;
    break;
  case 7:
    i = 10;
    break;
  default:
    local_14 = 1;
    local_10 = ispec;
    input_error("sp_ienv",&local_14);
    i = 0;
  }
  return i;
}

Assistant:

int
sp_ienv(int ispec)
{
    int i;
    extern int input_error(char *, int *);

    switch (ispec) {
	case 1: return (20);
	case 2: return (10);
	case 3: return (200);
	case 4: return (200);
	case 5: return (100);
        case 6: return (30);
        case 7: return (10);
    }

    /* Invalid value for ISPEC */
    i = 1;
    input_error("sp_ienv", &i);
    return 0;

}